

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketnotifier.cpp
# Opt level: O0

bool __thiscall QSocketNotifier::event(QSocketNotifier *this,QEvent *e)

{
  long lVar1;
  bool bVar2;
  ConnectionType c;
  DescriptorType DVar3;
  QSocketNotifierPrivate *pQVar4;
  QEvent *in_RSI;
  QMetaMethodArgument *in_RDI;
  long in_FS_OFFSET;
  QSocketNotifierPrivate *d;
  QPointer<QSocketNotifier> alive;
  QSocketNotifier *in_stack_ffffffffffffff68;
  QPointer<QSocketNotifier> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  QObject *in_stack_ffffffffffffff98;
  bool local_3d;
  QEvent *in_stack_ffffffffffffffc8;
  QObject *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QSocketNotifier *)0x428245);
  c = QEvent::type(in_RSI);
  if (c == 0x16) {
    if ((pQVar4->snenabled & 1U) != 0) {
      QtPrivate::Invoke::argument<bool>
                ((char *)in_RDI,
                 (bool *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      QMetaObject::invokeMethod<QMetaMethodArgument>
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,c,in_RDI);
      setEnabled((QSocketNotifier *)CONCAT44(c,in_stack_ffffffffffffff88),
                 SUB81((ulong)in_RDI >> 0x38,0));
    }
  }
  else if ((c == 0x32) || (c == 0xd3)) {
    QPointer<QSocketNotifier>::QPointer<void>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    activated((QSocketNotifier *)in_RDI,(pQVar4->sockfd).sockfd,pQVar4->sntype);
    bVar2 = QPointer::operator_cast_to_bool((QPointer<QSocketNotifier> *)0x42831c);
    if (bVar2) {
      DVar3 = QSocketDescriptor::operator_cast_to_int(&pQVar4->sockfd);
      activated((QSocketNotifier *)in_RDI,DVar3);
    }
    QPointer<QSocketNotifier>::~QPointer((QPointer<QSocketNotifier> *)0x428368);
    local_3d = true;
    goto LAB_00428386;
  }
  local_3d = QObject::event(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
LAB_00428386:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_3d;
}

Assistant:

bool QSocketNotifier::event(QEvent *e)
{
    Q_D(QSocketNotifier);
    // Emits the activated() signal when a QEvent::SockAct or QEvent::SockClose is
    // received.
    switch (e->type()) {
    case QEvent::ThreadChange:
        if (d->snenabled) {
            QMetaObject::invokeMethod(this, "setEnabled", Qt::QueuedConnection,
                                      Q_ARG(bool, d->snenabled));
            setEnabled(false);
        }
        break;
    case QEvent::SockAct:
    case QEvent::SockClose:
        {
            QPointer<QSocketNotifier> alive(this);
            emit activated(d->sockfd, d->sntype, QPrivateSignal());
            // ### Qt7: Remove emission if the activated(int) signal is removed
            if (alive)
                emit activated(int(qintptr(d->sockfd)), QPrivateSignal());
        }
        return true;
    default:
        break;
    }
    return QObject::event(e);
}